

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::Server::read_content(Server *this,Stream *strm,Request *req,Response *res)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar5;
  int file_count;
  iterator cur;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cache;
  undefined4 local_10c;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  undefined8 local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  undefined1 local_b8 [32];
  _Base_ptr local_98;
  size_t local_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_e0 = 0;
  local_10c = 0;
  local_108._8_8_ = 0;
  pcStack_f0 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5601:11)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5601:11)>
             ::_M_manager;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_108._M_unused._M_object = req;
  local_d8._M_unused._M_object = operator_new(0x18);
  *(undefined4 **)local_d8._M_unused._0_8_ = &local_10c;
  local_68._M_unused._M_object = &local_e0;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = local_68._M_unused._M_object;
  *(Request **)((long)local_d8._M_unused._0_8_ + 0x10) = req;
  pcStack_c0 = std::
               _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5607:11)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5607:11)>
             ::_M_manager;
  local_68._8_8_ = 0;
  pcStack_50 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5614:11)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5614:11)>
             ::_M_manager;
  bVar2 = read_content_core(this,strm,req,res,(ContentReceiver *)&local_108,
                            (MultipartContentHeader *)&local_d8,(ContentReceiver *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (bVar2) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Content-Type","");
    pVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::equal_range(&(req->headers)._M_t,(key_type *)local_b8);
    if (pVar5.first._M_node._M_node == pVar5.second._M_node._M_node) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)(pVar5.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string((string *)local_48,pcVar4,(allocator *)local_88._M_pod_data);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    lVar3 = std::__cxx11::string::find((char *)local_48,0x16a967,0);
    bVar2 = true;
    if (lVar3 == 0) {
      uVar1 = (req->body)._M_string_length;
      if (uVar1 < 0x2001) {
        local_b8._24_8_ = local_b8 + 8;
        local_b8._8_4_ = _S_red;
        local_b8._16_8_ = 0;
        local_90 = 0;
        pcVar4 = (req->body)._M_dataplus._M_p;
        local_88._8_8_ = &req->params;
        pcStack_70 = std::
                     _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:3955:45)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:3955:45)>
                   ::_M_manager;
        local_98 = (_Base_ptr)local_b8._24_8_;
        local_88._M_unused._M_object = (key_type *)local_b8;
        detail::split(pcVar4,pcVar4 + uVar1,'&',
                      (function<void_(const_char_*,_const_char_*)> *)&local_88);
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b8);
      }
      else {
        res->status = 0x19d;
        bVar2 = false;
      }
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool Server::read_content(Stream &strm, Request &req, Response &res) {
  MultipartFormDataMap::iterator cur;
  auto file_count = 0;
  if (read_content_core(
          strm, req, res,
          // Regular
          [&](const char *buf, size_t n) {
            if (req.body.size() + n > req.body.max_size()) { return false; }
            req.body.append(buf, n);
            return true;
          },
          // Multipart
          [&](const MultipartFormData &file) {
            if (file_count++ == CPPHTTPLIB_MULTIPART_FORM_DATA_FILE_MAX_COUNT) {
              return false;
            }
            cur = req.files.emplace(file.name, file);
            return true;
          },
          [&](const char *buf, size_t n) {
            auto &content = cur->second.content;
            if (content.size() + n > content.max_size()) { return false; }
            content.append(buf, n);
            return true;
          })) {
    const auto &content_type = req.get_header_value("Content-Type");
    if (!content_type.find("application/x-www-form-urlencoded")) {
      if (req.body.size() > CPPHTTPLIB_FORM_URL_ENCODED_PAYLOAD_MAX_LENGTH) {
        res.status = 413; // NOTE: should be 414?
        return false;
      }
      detail::parse_query_text(req.body, req.params);
    }
    return true;
  }
  return false;
}